

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entry.c
# Opt level: O1

char * stumpless_get_entry_param_value_by_name
                 (stumpless_entry *entry,char *element_name,char *param_name)

{
  _Bool _Var1;
  stumpless_element *element;
  char *pcVar2;
  size_t param_name_len;
  size_t local_20;
  
  if (param_name == (char *)0x0) {
    raise_argument_empty("param_name was NULL");
  }
  else {
    _Var1 = validate_param_name(param_name,&local_20);
    if ((_Var1) &&
       (element = stumpless_get_element_by_name(entry,element_name),
       element != (stumpless_element *)0x0)) {
      pcVar2 = stumpless_get_param_value_by_name(element,param_name);
      return pcVar2;
    }
  }
  return (char *)0x0;
}

Assistant:

const char *
stumpless_get_entry_param_value_by_name( const struct stumpless_entry *entry,
                                         const char *element_name,
                                         const char *param_name ) {
  size_t param_name_len;
  const struct stumpless_element *element;

  VALIDATE_ARG_NOT_NULL( param_name );

  if( unlikely( !validate_param_name( param_name, &param_name_len ) ) ) {
    return NULL;
  }

  element = stumpless_get_element_by_name( entry, element_name );
  if( !element ) {
    return NULL;
  }

  return stumpless_get_param_value_by_name( element, param_name );
}